

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiIO::AddInputCharacterUTF16(ImGuiIO *this,ImWchar16 c)

{
  ImWchar16 IVar1;
  ushort uVar2;
  
  IVar1 = this->InputQueueSurrogate;
  if ((c != 0 || IVar1 != 0) && (this->AppAcceptingEvents == true)) {
    if ((c & 0xfc00) != 0xd800) {
      if (IVar1 != 0) {
        uVar2 = 0xfffd;
        if ((c & 0xfc00) != 0xdc00) {
          AddInputCharacter(this,0xfffd);
          uVar2 = c;
        }
        c = uVar2;
        this->InputQueueSurrogate = 0;
      }
      AddInputCharacter(this,(uint)c);
      return;
    }
    if (IVar1 != 0) {
      AddInputCharacter(this,0xfffd);
    }
    this->InputQueueSurrogate = c;
  }
  return;
}

Assistant:

void ImGuiIO::AddInputCharacterUTF16(ImWchar16 c)
{
    if ((c == 0 && InputQueueSurrogate == 0) || !AppAcceptingEvents)
        return;

    if ((c & 0xFC00) == 0xD800) // High surrogate, must save
    {
        if (InputQueueSurrogate != 0)
            AddInputCharacter(IM_UNICODE_CODEPOINT_INVALID);
        InputQueueSurrogate = c;
        return;
    }

    ImWchar cp = c;
    if (InputQueueSurrogate != 0)
    {
        if ((c & 0xFC00) != 0xDC00) // Invalid low surrogate
        {
            AddInputCharacter(IM_UNICODE_CODEPOINT_INVALID);
        }
        else
        {
#if IM_UNICODE_CODEPOINT_MAX == 0xFFFF
            cp = IM_UNICODE_CODEPOINT_INVALID; // Codepoint will not fit in ImWchar
#else
            cp = (ImWchar)(((InputQueueSurrogate - 0xD800) << 10) + (c - 0xDC00) + 0x10000);
#endif
        }

        InputQueueSurrogate = 0;
    }
    AddInputCharacter((unsigned)cp);
}